

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shmobjectmanager.cpp
# Opt level: O0

PAL_ERROR __thiscall
CorUnix::CSharedMemoryObjectManager::LocateObject
          (CSharedMemoryObjectManager *this,CPalThread *pthr,CPalString *psObjectToLocate,
          CAllowedObjectTypes *paot,IPalObject **ppobj)

{
  bool bVar1;
  DWORD DVar2;
  int iVar3;
  DWORD DVar4;
  PalObjectTypeId eTypeId;
  WCHAR *pWVar5;
  size_t sVar6;
  CSharedMemoryObject *pCVar7;
  undefined4 extraout_var;
  WCHAR *string2;
  CObjectType *pCVar8;
  CObjectType *pot;
  CObjectAttributes oa;
  CSharedMemoryObject *pshmobj_1;
  CSharedMemoryObject *pshmobj;
  CObjectAttributes *poa;
  PLIST_ENTRY ple;
  LPWSTR pwsz;
  SHMObjData *psmod;
  SHMPTR shmObjectListEntry;
  SHMPTR shmSharedObjectData;
  IPalObject *pobjExisting;
  PAL_ERROR palError;
  IPalObject **ppobj_local;
  CAllowedObjectTypes *paot_local;
  CPalString *psObjectToLocate_local;
  CPalThread *pthr_local;
  CSharedMemoryObjectManager *this_local;
  CPalString *this_00;
  
  pobjExisting._4_4_ = 0;
  shmSharedObjectData = 0;
  shmObjectListEntry = 0;
  pwsz = (LPWSTR)0x0;
  ple = (PLIST_ENTRY)0x0;
  if (pthr == (CPalThread *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x202);
    fprintf(_stderr,"Expression: NULL != pthr\n");
  }
  if (psObjectToLocate == (CPalString *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x203);
    fprintf(_stderr,"Expression: NULL != psObjectToLocate\n");
  }
  pWVar5 = CPalString::GetString(psObjectToLocate);
  if (pWVar5 == (WCHAR *)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x204);
    fprintf(_stderr,"Expression: NULL != psObjectToLocate->GetString()\n");
  }
  pWVar5 = CPalString::GetString(psObjectToLocate);
  sVar6 = PAL_wcslen(pWVar5);
  DVar2 = CPalString::GetStringLength(psObjectToLocate);
  if (sVar6 != DVar2) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x205);
    fprintf(_stderr,
            "Expression: PAL_wcslen(psObjectToLocate->GetString()) == psObjectToLocate->GetStringLength()\n"
           );
  }
  if (ppobj == (IPalObject **)0x0) {
    fprintf(_stderr,"] %s %s:%d","LocateObject",
            "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
            ,0x206);
    fprintf(_stderr,"Expression: NULL != ppobj\n");
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
    abort();
  }
  CPalString::GetString(psObjectToLocate);
  InternalEnterCriticalSection(pthr,&this->m_csListLock);
  for (poa = (CObjectAttributes *)(this->m_leNamedObjects).Flink;
      pCVar7 = (CSharedMemoryObject *)shmSharedObjectData,
      poa != (CObjectAttributes *)&this->m_leNamedObjects;
      poa = (CObjectAttributes *)(poa->sObjectName).m_pwsz) {
    pCVar7 = CSharedMemoryObject::GetObjectFromListLink((PLIST_ENTRY)poa);
    iVar3 = (*(pCVar7->super_CPalObjectBase).super_IPalObject._vptr_IPalObject[1])();
    this_00 = (CPalString *)CONCAT44(extraout_var,iVar3);
    if (this_00 == (CPalString *)0x0) {
      fprintf(_stderr,"] %s %s:%d","LocateObject",
              "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
              ,0x223);
      fprintf(_stderr,"Expression: NULL != poa\n");
    }
    DVar2 = CPalString::GetStringLength(this_00);
    DVar4 = CPalString::GetStringLength(psObjectToLocate);
    if (DVar2 == DVar4) {
      pWVar5 = CPalString::GetString(this_00);
      string2 = CPalString::GetString(psObjectToLocate);
      iVar3 = PAL_wcscmp(pWVar5,string2);
      if (iVar3 == 0) break;
    }
  }
  shmSharedObjectData = (SHMPTR)pCVar7;
  if (shmSharedObjectData == 0) {
    SHMLock();
    psmod = (SHMObjData *)SHMGetInfo(SIID_NAMED_OBJECTS);
    while (psmod != (SHMObjData *)0x0) {
      pwsz = (LPWSTR)SHMPtrToPtr((SHMPTR)psmod);
      if (pwsz == (LPWSTR)0x0) {
        fprintf(_stderr,"] %s %s:%d","LocateObject",
                "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                ,0x279);
        fprintf(_stderr,"Unable to map shmObjectListEntry\n");
        break;
      }
      DVar2 = *(DWORD *)(pwsz + 0x1a);
      DVar4 = CPalString::GetStringLength(psObjectToLocate);
      if (DVar2 == DVar4) {
        ple = (PLIST_ENTRY)SHMPtrToPtr(*(SHMPTR *)(pwsz + 0xc));
        if (ple == (PLIST_ENTRY)0x0) {
          fprintf(_stderr,"] %s %s:%d","LocateObject",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x270);
          fprintf(_stderr,"Unable to map psmod->shmObjName\n");
          break;
        }
        pWVar5 = CPalString::GetString(psObjectToLocate);
        iVar3 = PAL_wcscmp((char16_t *)ple,pWVar5);
        if (iVar3 == 0) {
          shmObjectListEntry = (SHMPTR)psmod;
          break;
        }
      }
      psmod = *(SHMObjData **)(pwsz + 4);
    }
    if (shmObjectListEntry == 0) {
      pobjExisting._4_4_ = 0x7b;
    }
    else {
      oa.pSecurityAttributes = (LPSECURITY_ATTRIBUTES)0x0;
      CObjectAttributes::CObjectAttributes
                ((CObjectAttributes *)&pot,(WCHAR *)ple,(LPSECURITY_ATTRIBUTES)0x0);
      bVar1 = CAllowedObjectTypes::IsTypeAllowed(paot,*(PalObjectTypeId *)(pwsz + 0x1c));
      if (bVar1) {
        pCVar8 = CObjectType::GetObjectTypeById(*(PalObjectTypeId *)(pwsz + 0x1c));
        if (pCVar8 == (CObjectType *)0x0) {
          fprintf(_stderr,"] %s %s:%d","LocateObject",
                  "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/pal/src/objmgr/shmobjectmanager.cpp"
                  ,0x295);
          fprintf(_stderr,"Invalid object type ID in shared memory info\n");
        }
        else {
          if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
          pobjExisting._4_4_ =
               ImportSharedObjectIntoProcess
                         (this,pthr,pCVar8,(CObjectAttributes *)&pot,shmObjectListEntry,
                          (SHMObjData *)pwsz,true,(CSharedMemoryObject **)&oa.pSecurityAttributes);
          if (pobjExisting._4_4_ == 0) {
            *ppobj = (IPalObject *)oa.pSecurityAttributes;
          }
          else if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
            abort();
          }
        }
      }
      else {
        if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
          abort();
        }
        pobjExisting._4_4_ = 6;
      }
    }
    SHMRelease();
  }
  else {
    pCVar8 = (CObjectType *)(*(code *)**(undefined8 **)shmSharedObjectData)();
    eTypeId = CObjectType::GetId(pCVar8);
    bVar1 = CAllowedObjectTypes::IsTypeAllowed(paot,eTypeId);
    if (bVar1) {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      (**(code **)(*(long *)shmSharedObjectData + 0x38))();
      *ppobj = (IPalObject *)shmSharedObjectData;
    }
    else {
      if ((PAL_InitializeChakraCoreCalled & 1U) == 0) {
        abort();
      }
      pobjExisting._4_4_ = 6;
    }
  }
  InternalLeaveCriticalSection(pthr,&this->m_csListLock);
  if ((PAL_InitializeChakraCoreCalled & 1U) != 0) {
    return pobjExisting._4_4_;
  }
  abort();
}

Assistant:

PAL_ERROR
CSharedMemoryObjectManager::LocateObject(
    CPalThread *pthr,
    CPalString *psObjectToLocate,
    CAllowedObjectTypes *paot,
    IPalObject **ppobj               // OUT
    )
{
    PAL_ERROR palError = NO_ERROR;
    IPalObject *pobjExisting = NULL;
    SHMPTR shmSharedObjectData = SHMNULL;
    SHMPTR shmObjectListEntry = SHMNULL;
    SHMObjData *psmod = NULL;
    LPWSTR pwsz = NULL;

    _ASSERTE(NULL != pthr);
    _ASSERTE(NULL != psObjectToLocate);
    _ASSERTE(NULL != psObjectToLocate->GetString());
    _ASSERTE(PAL_wcslen(psObjectToLocate->GetString()) == psObjectToLocate->GetStringLength());
    _ASSERTE(NULL != ppobj);

    ENTRY("CSharedMemoryObjectManager::LocateObject "
        "(this=%p, pthr=%p, psObjectToLocate=%p, paot=%p, "
        "ppobj=%p)\n",
        this,
        pthr,
        psObjectToLocate,
        paot,
        ppobj
        );

    TRACE("Searching for object name %S\n", psObjectToLocate->GetString());

    InternalEnterCriticalSection(pthr, &m_csListLock);

    //
    // Search the local named object list for this object
    //

    for (PLIST_ENTRY ple = m_leNamedObjects.Flink;
         ple != &m_leNamedObjects;
         ple = ple->Flink)
    {
        CObjectAttributes *poa;
        CSharedMemoryObject *pshmobj =
            CSharedMemoryObject::GetObjectFromListLink(ple);

        poa = pshmobj->GetObjectAttributes();
        _ASSERTE(NULL != poa);

        if (poa->sObjectName.GetStringLength() != psObjectToLocate->GetStringLength())
        {
            continue;
        }

        if (0 != PAL_wcscmp(poa->sObjectName.GetString(), psObjectToLocate->GetString()))
        {
            continue;
        }

        //
        // This object has the name we're looking for
        //

        pobjExisting = static_cast<IPalObject*>(pshmobj);
        break;        
    } 

    if (NULL != pobjExisting)
    {
        //
        //  Validate the located object's type
        //

        if (paot->IsTypeAllowed(
                pobjExisting->GetObjectType()->GetId()
                ))
        {
            TRACE("Local object exists with compatible type\n");
            
            //
            // Add a reference to the found object
            //

            pobjExisting->AddReference();
            *ppobj = pobjExisting;
        }
        else
        {
            TRACE("Local object exists w/ incompatible type\n");            
            palError = ERROR_INVALID_HANDLE;
        }
        
        goto LocateObjectExit;
    }

    //
    // Search the shared memory named object list for a matching object
    //
    
    SHMLock();
    
    shmObjectListEntry = SHMGetInfo(SIID_NAMED_OBJECTS);
    while (SHMNULL != shmObjectListEntry)
    {
        psmod = SHMPTR_TO_TYPED_PTR(SHMObjData, shmObjectListEntry);
        if (NULL != psmod)
        {
            if (psmod->dwNameLength == psObjectToLocate->GetStringLength())
            {
                pwsz = SHMPTR_TO_TYPED_PTR(WCHAR, psmod->shmObjName);
                if (NULL != pwsz)
                {
                    if (0 == PAL_wcscmp(pwsz, psObjectToLocate->GetString()))
                    {
                        //
                        // This is the object we were looking for.
                        //

                        shmSharedObjectData = shmObjectListEntry;
                        break;
                    }
                }
                else
                {
                    ASSERT("Unable to map psmod->shmObjName\n");
                    break;
                }                
            }

            shmObjectListEntry = psmod->shmNextObj;
        }
        else
        {
            ASSERT("Unable to map shmObjectListEntry\n");
            break;
        }
    }

    if (SHMNULL != shmSharedObjectData)
    {
        CSharedMemoryObject *pshmobj = NULL;
        CObjectAttributes oa(pwsz, NULL);

        //
        // Check if the type is allowed
        //

        if (!paot->IsTypeAllowed(psmod->eTypeId))
        {
            TRACE("Remote object exists w/ incompatible type\n");
            palError = ERROR_INVALID_HANDLE;
            goto LocateObjectExitSHMRelease;
        }
        
        //
        // Get the local instance of the CObjectType
        //
        
        CObjectType *pot = CObjectType::GetObjectTypeById(psmod->eTypeId);
        if (NULL == pot)
        {
            ASSERT("Invalid object type ID in shared memory info\n");
            goto LocateObjectExitSHMRelease;
        }

        TRACE("Remote object exists compatible type -- importing\n");
        
        //
        // Create the local state for the shared object
        //

        palError = ImportSharedObjectIntoProcess(
            pthr,
            pot,
            &oa,
            shmSharedObjectData,
            psmod,
            TRUE,
            &pshmobj
            );

        if (NO_ERROR == palError)
        {   
            *ppobj = static_cast<IPalObject*>(pshmobj);
        }
        else
        {
            ERROR("Failure initializing object from shared data\n");
            goto LocateObjectExitSHMRelease;
        }
        
    }
    else
    {
        //
        // The object was not found
        //

        palError = ERROR_INVALID_NAME;
    }

LocateObjectExitSHMRelease:

    SHMRelease();

LocateObjectExit:

    InternalLeaveCriticalSection(pthr, &m_csListLock);

    LOGEXIT("CSharedMemoryObjectManager::LocateObject returns %d\n", palError);

    return palError;
}